

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O3

void __thiscall
TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
TPZParFrontMatrix(TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                  *this)

{
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
  TPZFrontMatrix(&this->
                  super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                 ,&PTR_PTR_01991ad8);
  (this->
  super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>).
  super_TPZAbstractFrontMatrix<long_double>.super_TPZMatrix<long_double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZParFrontMatrix_01991850;
  *(undefined1 **)&this->field_0x33490 = &this->field_0x334a8;
  *(undefined8 *)&this->field_0x33498 = 0;
  *(undefined8 *)&this->field_0x334a0 = 0;
  *(undefined ***)
   &(this->
    super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
    ).field_0x33488 = &PTR__TPZManVector_019a1f98;
  this->fFinish = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->fwritecond);
  TPZManVector<TPZEqnArray<long_double>_*,_10>::Resize
            ((TPZManVector<TPZEqnArray<long_double>_*,_10> *)
             &(this->
              super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
              ).field_0x33488,0);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix():
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}